

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

EnvironmentType StrToEnvironmentType(char *str)

{
  int iVar1;
  EnvironmentType EVar2;
  
  if (((*str == '2') && (str[1] == 'd')) && (str[2] == '\0')) {
    EVar2 = ENV_TYPE_2D;
  }
  else {
    iVar1 = strcmp(str,"2duu");
    if (iVar1 == 0) {
      EVar2 = ENV_TYPE_2DUU;
    }
    else {
      iVar1 = strcmp(str,"xytheta");
      if (iVar1 == 0) {
        EVar2 = ENV_TYPE_XYTHETA;
      }
      else {
        iVar1 = strcmp(str,"xythetamlev");
        if (iVar1 == 0) {
          EVar2 = ENV_TYPE_XYTHETAMLEV;
        }
        else {
          iVar1 = strcmp(str,"robarm");
          EVar2 = -(uint)(iVar1 != 0) | ENV_TYPE_ROBARM;
        }
      }
    }
  }
  return EVar2;
}

Assistant:

EnvironmentType StrToEnvironmentType(const char* str)
{
    if (!strcmp(str, "2d")) {
        return ENV_TYPE_2D;
    }
    else if (!strcmp(str, "2duu")) {
        return ENV_TYPE_2DUU;
    }
    else if (!strcmp(str, "xytheta")) {
        return ENV_TYPE_XYTHETA;
    }
    else if (!strcmp(str, "xythetamlev")) {
        return ENV_TYPE_XYTHETAMLEV;
    }
    else if (!strcmp(str, "robarm")) {
        return ENV_TYPE_ROBARM;
    }
    else {
        return INVALID_ENV_TYPE;
    }
}